

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

void __thiscall CTcTokenizer::add_inc_path(CTcTokenizer *this,char *path)

{
  size_t sVar1;
  tctok_incpath_t *ptVar2;
  tctok_incpath_t *ptVar3;
  
  sVar1 = strlen(path);
  ptVar2 = (tctok_incpath_t *)malloc(sVar1 + 0x10);
  strcpy(ptVar2->path,path);
  ptVar3 = (tctok_incpath_t *)&this->incpath_head_;
  if (this->incpath_tail_ != (tctok_incpath_t *)0x0) {
    ptVar3 = this->incpath_tail_;
  }
  ptVar3->nxt = ptVar2;
  this->incpath_tail_ = ptVar2;
  ptVar2->nxt = (tctok_incpath_t *)0x0;
  return;
}

Assistant:

void CTcTokenizer::add_inc_path(const char *path)
{
    tctok_incpath_t *entry;
    
    /* create a new path list entry */
    entry = (tctok_incpath_t *)t3malloc(sizeof(tctok_incpath_t)
                                        + strlen(path));

    /* store the path in the entry */
    strcpy(entry->path, path);

    /* link this entry at the end of our list */
    if (incpath_tail_ != 0)
        incpath_tail_->nxt = entry;
    else
        incpath_head_ = entry;
    incpath_tail_ = entry;
    entry->nxt = 0;
}